

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O0

void __thiscall crypto_tests::chacha20_midblock::test_method(chacha20_midblock *this)

{
  Span<const_std::byte> key_00;
  Span<const_std::byte> key_01;
  Span<std::byte> out;
  Span<std::byte> out_00;
  Span<std::byte> out_01;
  Span<std::byte> out_02;
  bool bVar1;
  size_t in_RDI;
  long in_FS_OFFSET;
  byte b2 [7];
  byte b1 [5];
  byte b3 [52];
  byte block [64];
  ChaCha20 c20;
  array<std::byte,_32UL> key;
  ChaCha20 *in_stack_fffffffffffffb68;
  undefined7 in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb77;
  ChaCha20 *in_stack_fffffffffffffb78;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  Span<std::byte> *in_stack_fffffffffffffb88;
  const_string *in_stack_fffffffffffffb90;
  undefined7 in_stack_fffffffffffffb98;
  undefined1 in_stack_fffffffffffffb9f;
  const_string *in_stack_fffffffffffffba0;
  const_string *file;
  undefined7 in_stack_fffffffffffffba8;
  undefined1 in_stack_fffffffffffffbaf;
  ChaCha20 *in_stack_fffffffffffffbd8;
  byte *in_stack_fffffffffffffc20;
  const_string local_3d0 [2];
  lazy_ostream local_3b0 [2];
  const_string local_338 [2];
  lazy_ostream local_318;
  Span<std::byte> local_2e8;
  assertion_result local_2d8 [2];
  const_string local_2a0 [2];
  lazy_ostream local_280 [3];
  Span<std::byte> local_250;
  assertion_result local_240 [6];
  undefined1 local_1a8 [7];
  undefined1 local_1a1 [5];
  undefined1 local_19c [116];
  undefined1 local_128 [140];
  undefined1 local_9c [116];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  Span<std::byte_const>::Span<std::array<std::byte,32ul>>
            ((Span<const_std::byte> *)in_stack_fffffffffffffb78,
             (array<std::byte,_32UL> *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70)
             ,in_stack_fffffffffffffb68);
  key_00.m_data._7_1_ = in_stack_fffffffffffffb87;
  key_00.m_data._0_7_ = in_stack_fffffffffffffb80;
  key_00.m_size = (size_t)in_stack_fffffffffffffb88;
  ChaCha20::ChaCha20(in_stack_fffffffffffffb68,key_00);
  Span<std::byte>::Span<64>((Span<std::byte> *)in_stack_fffffffffffffb68,(byte (*) [64])0x57173a);
  out.m_size = in_RDI;
  out.m_data = in_stack_fffffffffffffc20;
  ChaCha20::Keystream(in_stack_fffffffffffffbd8,out);
  Span<std::byte_const>::Span<std::array<std::byte,32ul>>
            ((Span<const_std::byte> *)in_stack_fffffffffffffb78,
             (array<std::byte,_32UL> *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70)
             ,in_stack_fffffffffffffb68);
  key_01.m_data._7_1_ = in_stack_fffffffffffffb87;
  key_01.m_data._0_7_ = in_stack_fffffffffffffb80;
  key_01.m_size = (size_t)in_stack_fffffffffffffb88;
  ChaCha20::ChaCha20(in_stack_fffffffffffffb68,key_01);
  memcpy(local_9c,local_19c,0x74);
  ChaCha20::~ChaCha20(in_stack_fffffffffffffb78);
  Span<std::byte>::Span<5>((Span<std::byte> *)in_stack_fffffffffffffb68,(byte (*) [5])0x5717cf);
  out_00.m_size = in_RDI;
  out_00.m_data = in_stack_fffffffffffffc20;
  ChaCha20::Keystream(in_stack_fffffffffffffbd8,out_00);
  Span<std::byte>::Span<7>((Span<std::byte> *)in_stack_fffffffffffffb68,(byte (*) [7])0x571801);
  out_01.m_size = in_RDI;
  out_01.m_data = in_stack_fffffffffffffc20;
  ChaCha20::Keystream(in_stack_fffffffffffffbd8,out_01);
  Span<std::byte>::Span<52>((Span<std::byte> *)in_stack_fffffffffffffb68,(byte (*) [52])0x571833);
  out_02.m_size = in_RDI;
  out_02.m_data = in_stack_fffffffffffffc20;
  ChaCha20::Keystream(in_stack_fffffffffffffbd8,out_02);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,
               (pointer)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (unsigned_long)in_stack_fffffffffffffb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
               in_stack_fffffffffffffba0,
               CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98),
               in_stack_fffffffffffffb90);
    Span<std::byte>::Span<64>((Span<std::byte> *)in_stack_fffffffffffffb68,(byte (*) [64])0x5718c7);
    local_250 = Span<std::byte>::first
                          ((Span<std::byte> *)in_stack_fffffffffffffb78,
                           CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
    std::ranges::__equal_fn::
    operator()<Span<std::byte>,_std::byte_(&)[5],_std::ranges::equal_to,_std::identity,_std::identity>
              ((__equal_fn *)&std::ranges::equal,&local_250,local_1a1);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffb78,(bool)in_stack_fffffffffffffb77);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,
               (pointer)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (unsigned_long)in_stack_fffffffffffffb68);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (basic_cstring<const_char> *)in_stack_fffffffffffffb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,
               (pointer)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (unsigned_long)in_stack_fffffffffffffb68);
    in_stack_fffffffffffffb68 = (ChaCha20 *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_240,local_280,local_2a0,0x34e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffb68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,
               (pointer)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (unsigned_long)in_stack_fffffffffffffb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
               in_stack_fffffffffffffba0,
               CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98),
               in_stack_fffffffffffffb90);
    Span<std::byte>::Span<64>((Span<std::byte> *)in_stack_fffffffffffffb68,(byte (*) [64])0x571a65);
    local_2e8 = Span<std::byte>::subspan
                          (in_stack_fffffffffffffb88,
                           CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                           (size_t)in_stack_fffffffffffffb78);
    std::ranges::__equal_fn::
    operator()<Span<std::byte>,_std::byte_(&)[7],_std::ranges::equal_to,_std::identity,_std::identity>
              ((__equal_fn *)&std::ranges::equal,&local_2e8,local_1a8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffb78,(bool)in_stack_fffffffffffffb77);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,
               (pointer)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (unsigned_long)in_stack_fffffffffffffb68);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (basic_cstring<const_char> *)in_stack_fffffffffffffb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,
               (pointer)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (unsigned_long)in_stack_fffffffffffffb68);
    in_stack_fffffffffffffb68 = (ChaCha20 *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2d8,&local_318,local_338,0x34f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffb68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffb68);
    in_stack_fffffffffffffbaf = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffbaf);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,
               (pointer)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (unsigned_long)in_stack_fffffffffffffb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),file
               ,CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98),
               in_stack_fffffffffffffb90);
    in_stack_fffffffffffffb90 = (const_string *)&stack0xfffffffffffffc70;
    Span<std::byte>::Span<64>((Span<std::byte> *)in_stack_fffffffffffffb68,(byte (*) [64])0x571c02);
    Span<std::byte>::last
              ((Span<std::byte> *)in_stack_fffffffffffffb78,
               CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
    in_stack_fffffffffffffb9f =
         std::ranges::__equal_fn::
         operator()<Span<std::byte>,_std::byte_(&)[52],_std::ranges::equal_to,_std::identity,_std::identity>
                   ((__equal_fn *)&std::ranges::equal,&stack0xfffffffffffffc80,local_128);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffb78,(bool)in_stack_fffffffffffffb77);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,
               (pointer)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (unsigned_long)in_stack_fffffffffffffb68);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (basic_cstring<const_char> *)in_stack_fffffffffffffb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,
               (pointer)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (unsigned_long)in_stack_fffffffffffffb68);
    in_stack_fffffffffffffb68 = (ChaCha20 *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffc90,local_3b0,local_3d0,0x350,CHECK,
               CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffb68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  ChaCha20::~ChaCha20(in_stack_fffffffffffffb78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(chacha20_midblock)
{
    auto key = "0000000000000000000000000000000000000000000000000000000000000000"_hex;
    ChaCha20 c20{key};
    // get one block of keystream
    std::byte block[64];
    c20.Keystream(block);
    std::byte b1[5], b2[7], b3[52];
    c20 = ChaCha20{key};
    c20.Keystream(b1);
    c20.Keystream(b2);
    c20.Keystream(b3);

    BOOST_CHECK(std::ranges::equal(Span{block}.first(5), b1));
    BOOST_CHECK(std::ranges::equal(Span{block}.subspan(5, 7), b2));
    BOOST_CHECK(std::ranges::equal(Span{block}.last(52), b3));
}